

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeViewPrivate::beginAnimatedOperation(QTreeViewPrivate *this)

{
  AnimatedOperation *this_00;
  uint uVar1;
  QAbstractItemView *this_01;
  QWidgetData *pQVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  undefined1 local_80 [40];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar2 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  iVar8 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  iVar10 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  local_80._36_4_ = iVar10;
  local_80._32_4_ = iVar8;
  local_80._24_8_ = 0;
  this_00 = &this->animatedOperation;
  iVar4 = AnimatedOperation::top(this_00);
  local_80._28_4_ = iVar4;
  iVar5 = QAbstractAnimation::direction();
  if (iVar5 == 0) {
    iVar5 = (this->animatedOperation).item;
    uVar1 = *(uint *)&(this->viewItems).d.ptr[iVar5].field_0x1c;
    iVar9 = 0;
    if ((0xf < uVar1) && (iVar9 = 0, 0 < (iVar10 - iVar4) + 1)) {
      iVar7 = (uVar1 >> 4) + iVar5;
      iVar9 = 0;
      do {
        iVar5 = iVar5 + 1;
        iVar6 = itemHeight(this,iVar5);
        iVar9 = iVar6 + iVar9;
        if (iVar7 <= iVar5) break;
      } while (iVar9 < (iVar10 - iVar4) * 2 + 2);
    }
    iVar10 = iVar4 + iVar9 + -1;
    local_80._36_4_ = iVar10;
    iVar5 = AnimatedOperation::top(this_00);
    ::QVariant::QVariant(&local_58,iVar9 + iVar5);
    QVariantAnimation::setEndValue((QVariant *)this_00);
    ::QVariant::~QVariant(&local_58);
  }
  if ((-1 < iVar8) && (iVar4 <= iVar10)) {
    renderTreeToPixmapForAnimation((QTreeViewPrivate *)local_80,(QRect *)this);
    local_58.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    uVar3 = local_80._16_8_;
    local_58.d.data.shared = (PrivateShared *)QDataStream::operator<<;
    local_80._16_8_ = 0;
    local_58.d.data._16_8_ = *(undefined8 *)&(this->animatedOperation).field_0x40;
    *(undefined8 *)&(this->animatedOperation).field_0x40 = uVar3;
    QPixmap::~QPixmap((QPixmap *)&local_58);
    QPixmap::~QPixmap((QPixmap *)local_80);
    QAbstractItemView::setState(this_01,AnimatingState);
    QAbstractAnimation::start((DeletionPolicy)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::beginAnimatedOperation()
{
    Q_Q(QTreeView);

    QRect rect = viewport->rect();
    rect.setTop(animatedOperation.top());
    if (animatedOperation.direction() == QVariantAnimation::Forward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = animatedOperation.item + viewItems.at(animatedOperation.item).total + 1;
        for (int i = animatedOperation.item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(animatedOperation.top() + h);
    }

    if (!rect.isEmpty()) {
        animatedOperation.after = renderTreeToPixmapForAnimation(rect);

        q->setState(QAbstractItemView::AnimatingState);
        animatedOperation.start(); //let's start the animation
    }
}